

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int get_exts(void)

{
  GLubyte *__s;
  size_t sVar1;
  char *__dest;
  char *local_str;
  size_t len;
  char *gl_str_tmp;
  uint index;
  
  if (max_loaded_major < 3) {
    exts = (char *)(*glad_glGetString)(0x1f03);
  }
  else {
    num_exts_i = 0;
    (*glad_glGetIntegerv)(0x821d,&num_exts_i);
    if (0 < num_exts_i) {
      exts_i = (char **)malloc((long)num_exts_i << 3);
    }
    if (exts_i == (char **)0x0) {
      return 0;
    }
    for (gl_str_tmp._0_4_ = 0; (uint)gl_str_tmp < (uint)num_exts_i;
        gl_str_tmp._0_4_ = (uint)gl_str_tmp + 1) {
      __s = (*glad_glGetStringi)(0x1f03,(uint)gl_str_tmp);
      sVar1 = strlen((char *)__s);
      __dest = (char *)malloc(sVar1 + 1);
      if (__dest != (char *)0x0) {
        memcpy(__dest,__s,sVar1 + 1);
      }
      exts_i[(uint)gl_str_tmp] = __dest;
    }
  }
  return 1;
}

Assistant:

static int get_exts(void) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        exts = (const char *)glGetString(GL_EXTENSIONS);
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        unsigned int index;

        num_exts_i = 0;
        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts_i);
        if (num_exts_i > 0) {
            exts_i = (char **)malloc((size_t)num_exts_i * (sizeof *exts_i));
        }

        if (exts_i == NULL) {
            return 0;
        }

        for(index = 0; index < (unsigned)num_exts_i; index++) {
            const char *gl_str_tmp = (const char*)glGetStringi(GL_EXTENSIONS, index);
            size_t len = strlen(gl_str_tmp);

            char *local_str = (char*)malloc((len+1) * sizeof(char));
            if(local_str != NULL) {
                memcpy(local_str, gl_str_tmp, (len+1) * sizeof(char));
            }
            exts_i[index] = local_str;
        }
    }
#endif
    return 1;
}